

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O0

void testHeader(string *tempDir)

{
  ostream *this;
  exception *e;
  Test<const_Imf_3_4::Header> headerTest_1;
  Test<Imf_3_4::Header> headerTest;
  allocator<char> *in_stack_fffffffffffffea0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffea8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_131;
  string local_130 [24];
  string *in_stack_fffffffffffffee8;
  Test<const_Imf_3_4::Header> *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  Test<const_Imf_3_4::Header> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  Test<const_Imf_3_4::Header> *in_stack_ffffffffffffff10;
  allocator<char> local_e1;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  undefined1 local_69 [56];
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Test<Imf_3_4::Header>::testFind
            ((Test<Imf_3_4::Header> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Test<Imf_3_4::Header>::testSubscript
            ((Test<Imf_3_4::Header> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  __s = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffea0);
  Test<Imf_3_4::Header>::testIterators
            ((Test<Imf_3_4::Header> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  __a = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Test<const_Imf_3_4::Header>::testFind(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Test<const_Imf_3_4::Header>::testSubscript(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Test<const_Imf_3_4::Header>::testIterators(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  testEraseAttribute(in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  testEraseAttributeThrowsWithEmptyString();
  this = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testHeader (const string& tempDir)
{
    try
    {
        {
            Test<Header> headerTest;
            headerTest.testFind ("displayWindow");
            headerTest.testSubscript ("displayWindow");
            headerTest.testIterators ("displayWindow");
        }
        {
            Test<const Header> headerTest;
            headerTest.testFind ("displayWindow");
            headerTest.testSubscript ("displayWindow");
            headerTest.testIterators ("displayWindow");
        }
        testEraseAttribute ("displayWindow");
        testEraseAttributeThrowsWithEmptyString ();
        cout << "ok\n" << endl;
    }
    catch (const exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}